

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_SetAttributeValue
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_OBJECT_HANDLE hObject,
          CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount)

{
  byte bVar1;
  byte bVar2;
  Session *this_00;
  Token *pTVar3;
  long *plVar4;
  ulong uVar5;
  CK_STATE sessionState;
  HandleManager *in_RCX;
  CK_ATTRIBUTE_PTR in_RDX;
  undefined8 in_RSI;
  Token *in_RDI;
  CK_SESSION_HANDLE in_R8;
  P11Object *p11object;
  CK_BBOOL isModifiable;
  CK_RV rv;
  CK_BBOOL isPrivate;
  CK_BBOOL isOnToken;
  OSObject *object;
  Token *token;
  Session *session;
  Session *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffffa0;
  int op;
  undefined1 isPrivate_00;
  P11Object *in_stack_fffffffffffffff8;
  OSObject *object_00;
  
  isPrivate_00 = (undefined1)((ulong)in_RSI >> 0x38);
  if ((in_RDI->valid & 1U) == 0) {
    object_00 = (OSObject *)0x190;
  }
  else if (in_RCX == (HandleManager *)0x0) {
    object_00 = (OSObject *)0x7;
  }
  else {
    this_00 = (Session *)HandleManager::getSession(in_RCX,in_R8);
    if (this_00 == (Session *)0x0) {
      object_00 = (OSObject *)0xb3;
    }
    else {
      pTVar3 = Session::getToken(this_00);
      if (pTVar3 == (Token *)0x0) {
        object_00 = (OSObject *)0x5;
      }
      else {
        plVar4 = (long *)HandleManager::getObject(in_RCX,in_R8);
        op = (int)(in_R8 >> 0x20);
        if ((plVar4 == (long *)0x0) || (uVar5 = (**(code **)(*plVar4 + 0x50))(), (uVar5 & 1) == 0))
        {
          object_00 = (OSObject *)0x82;
        }
        else {
          bVar1 = (**(code **)(*plVar4 + 0x20))(plVar4,1,0);
          bVar2 = (**(code **)(*plVar4 + 0x20))(plVar4,2,1);
          sessionState = Session::getState(in_stack_ffffffffffffff88);
          object_00 = (OSObject *)haveWrite(sessionState,bVar1 & 1,bVar2 & 1);
          if (object_00 == (OSObject *)0x0) {
            bVar1 = (**(code **)(*plVar4 + 0x20))(plVar4,0x170,1);
            if ((bVar1 & 1) == 0) {
              object_00 = (OSObject *)0x1b;
            }
            else {
              object_00 = (OSObject *)
                          newP11Object(object_00,
                                       (P11Object **)
                                       (CONCAT17(bVar1,in_stack_ffffffffffffffa0) &
                                       0x1ffffffffffffff));
              if (object_00 == (OSObject *)0x0) {
                object_00 = (OSObject *)
                            P11Object::saveTemplate
                                      (in_stack_fffffffffffffff8,in_RDI,(bool)isPrivate_00,in_RDX,
                                       (CK_ULONG)in_RCX,op);
              }
            }
          }
          else {
            if (object_00 == (OSObject *)0x101) {
              softHSMLog(6,"C_SetAttributeValue",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                         ,0x777,"User is not authorized");
            }
            if (object_00 == (OSObject *)0xb5) {
              softHSMLog(6,"C_SetAttributeValue",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                         ,0x779,"Session is read-only");
            }
          }
        }
      }
    }
  }
  return (CK_RV)object_00;
}

Assistant:

CK_RV SoftHSM::C_SetAttributeValue(CK_SESSION_HANDLE hSession, CK_OBJECT_HANDLE hObject, CK_ATTRIBUTE_PTR pTemplate, CK_ULONG ulCount)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pTemplate == NULL) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the object handle.
	OSObject *object = (OSObject *)handleManager->getObject(hObject);
	if (object == NULL_PTR || !object->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isOnToken = object->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = object->getBooleanValue(CKA_PRIVATE, true);

	// Check user credentials
	CK_RV rv = haveWrite(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Check if the object is modifiable
	CK_BBOOL isModifiable = object->getBooleanValue(CKA_MODIFIABLE, true);
	if (!isModifiable) return CKR_ACTION_PROHIBITED;

	// Wrap a P11Object around the OSObject so we can access the attributes in the
	// context of the object in which it is defined.
	P11Object* p11object = NULL;
	rv = newP11Object(object,&p11object);
	if (rv != CKR_OK)
		return rv;

	// Ask the P11Object to save the template with attribute values.
	rv = p11object->saveTemplate(token, isPrivate != CK_FALSE, pTemplate,ulCount,OBJECT_OP_SET);
	delete p11object;
	return rv;
}